

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O0

void __thiscall
IO::writeDimerActivating
          (IO *this,vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *dimer_arr,
          string *filename)

{
  bool bVar1;
  reference paVar2;
  iterator pvVar3;
  ostream *poVar4;
  value_type_conflict1 bound;
  iterator __end2;
  iterator __begin2;
  array<int,_4UL> *__range2;
  array<int,_4UL> timestep;
  iterator __end1;
  iterator __begin1;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *__range1;
  string local_220 [8];
  ofstream outstream;
  string *filename_local;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *dimer_arr_local;
  IO *this_local;
  
  std::ofstream::ofstream(local_220);
  std::ofstream::open(local_220,(_Ios_Openmode)filename);
  __end1 = std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::begin
                     (dimer_arr);
  timestep._M_elems._8_8_ =
       std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::end(dimer_arr);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::array<int,_4UL>_*,_std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>_>
                                *)(timestep._M_elems + 2));
    if (!bVar1) break;
    paVar2 = __gnu_cxx::
             __normal_iterator<std::array<int,_4UL>_*,_std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>_>
             ::operator*(&__end1);
    __range2 = *(array<int,_4UL> **)paVar2->_M_elems;
    timestep._M_elems._0_8_ = *(undefined8 *)(paVar2->_M_elems + 2);
    __end2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&__range2);
    pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)&__range2);
    for (; __end2 != pvVar3; __end2 = __end2 + 1) {
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_220,*__end2);
      std::operator<<(poVar4,"\t");
    }
    std::ostream::operator<<((ostream *)local_220,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::array<int,_4UL>_*,_std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>_>
    ::operator++(&__end1);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void IO::writeDimerActivating(std::vector<std::array<int, 4>> dimer_arr, std::string filename) {
	std::ofstream outstream;
	outstream.open(filename, std::ios::app);
	for (auto timestep: dimer_arr){
		for (auto bound:  timestep){
			outstream << bound << "\t";
		}
		outstream << std::endl;
	}
	outstream.close();
}